

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallbuddyrange.h
# Opt level: O0

bool snmalloc::
     BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
     ::is_red(Contents k)

{
  Handle HVar1;
  Contents in_RDI;
  undefined8 local_50;
  undefined1 local_48 [15];
  bool local_39;
  undefined8 local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  
  local_30 = &local_50;
  local_38 = 0;
  local_50 = 0;
  local_20 = local_48;
  local_28 = &local_50;
  if (in_RDI.unsafe_capptr ==
      (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
       *)0x0) {
    local_39 = false;
  }
  else {
    HVar1 = ref(false,in_RDI);
    local_39 = (*HVar1.val & 1) == 1;
  }
  return local_39;
}

Assistant:

static bool is_red(Contents k)
    {
      if (k == nullptr)
        return false;
      return (address_cast(*ref(false, k)) & MASK) == MASK;
    }